

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoCube>::Read(TPZGeoElRefPattern<pzgeom::TPZGeoCube> *this)

{
  void *in_RDX;
  TPZStream *in_RSI;
  
  Read((TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)
       ((long)(this->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).fGeo.
              super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes +
       *(long *)(*(long *)&(this->super_TPZGeoElRefLess<pzgeom::TPZGeoCube>).super_TPZGeoEl + -0x48)
       + -0x48),in_RSI,in_RDX);
  return;
}

Assistant:

void TPZGeoElRefPattern<TGeo>::Read(TPZStream &str, void *context) {
    TPZGeoElRefLess<TGeo>::Read(str, context);
    str.Read(this->fSubEl);
    int refpatternindex;
    str.Read(&refpatternindex, 1);
    if (refpatternindex != -1) {
        const std::list< TPZAutoPointer<TPZRefPattern> > &RefPatternList = gRefDBase.RefPatternList(this->Type());
        std::list< TPZAutoPointer<TPZRefPattern> >::const_iterator it;

        for (it = RefPatternList.begin(); it != RefPatternList.end(); it++) {
            if ((*it)->Id() == refpatternindex) {
                break;
            }
        }

        if (it != RefPatternList.end()) {
            fRefPattern = *it;
        } else {
            DebugStop();
        }
    }
}